

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_>::ModeRm
          (ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *this,
          idx_t frame)

{
  __buckets_ptr pp_Var1;
  bool bVar2;
  uhugeint_t *rhs;
  mapped_type *pmVar3;
  uhugeint_t *in_RSI;
  unordered_map<duckdb::uhugeint_t,_duckdb::ModeAttr,_std::hash<duckdb::uhugeint_t>,_std::equal_to<duckdb::uhugeint_t>,_std::allocator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>_>_>
  *in_RDI;
  size_t old_count;
  mapped_type *attr;
  uhugeint_t *key;
  key_type *in_stack_ffffffffffffffc8;
  idx_t in_stack_ffffffffffffffd8;
  ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_>
  *in_stack_ffffffffffffffe0;
  
  rhs = GetCell(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pmVar3 = ::std::
           unordered_map<duckdb::uhugeint_t,_duckdb::ModeAttr,_std::hash<duckdb::uhugeint_t>,_std::equal_to<duckdb::uhugeint_t>,_std::allocator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>_>_>
           ::operator[](in_RDI,in_stack_ffffffffffffffc8);
  pp_Var1 = (__buckets_ptr)pmVar3->count;
  (in_RDI->_M_h)._M_rehash_policy._M_next_resize =
       (in_RDI->_M_h)._M_rehash_policy._M_next_resize - (ulong)(pp_Var1 == (__buckets_ptr)0x1);
  pmVar3->count = pmVar3->count - 1;
  if ((in_RDI[1]._M_h._M_buckets == pp_Var1) && (bVar2 = uhugeint_t::operator==(in_RSI,rhs), bVar2))
  {
    *(undefined1 *)&(in_RDI->_M_h)._M_single_bucket = 0;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}